

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  byte *pbVar5;
  char **ppcVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  int local_34;
  int tok;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar4 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 2:
    pbVar5 = (byte *)(ptr + 1);
    if ((long)end - (long)pbVar5 < 1) {
      enc_local._4_4_ = -1;
    }
    else {
      uVar2 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
      if (2 < uVar2 - 5) {
        if (uVar2 == 0xf) {
          iVar3 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
          return iVar3;
        }
        if (uVar2 == 0x10) {
          iVar3 = normal_scanDecl(enc,ptr + 2,end,nextTokPtr);
          return iVar3;
        }
        if (((uVar2 != 0x16) && (uVar2 != 0x18)) && (uVar2 != 0x1d)) {
          *nextTokPtr = (char *)pbVar5;
          return 0;
        }
      }
      *nextTokPtr = ptr;
      enc_local._4_4_ = 0x1d;
    }
    break;
  case 4:
    pcVar4 = ptr + 1;
    if ((long)end - (long)pcVar4 < 1) {
      enc_local._4_4_ = -0x1a;
    }
    else {
      if (*pcVar4 == ']') {
        if ((long)end - (long)pcVar4 < 2) {
          return -1;
        }
        if (ptr[2] == '>') {
          *nextTokPtr = ptr + 3;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar4;
      enc_local._4_4_ = 0x1a;
    }
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    ppcVar6 = (char **)ptr;
    iVar3 = (*enc[3].nameLength)(enc,ptr);
    if (iVar3 != 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    iVar3 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX,ppcVar6);
    if (iVar3 == 0) {
      iVar3 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_00,ppcVar6);
      if (iVar3 == 0) {
        *nextTokPtr = ptr;
        return 0;
      }
      end_local = ptr + 2;
      local_34 = 0x13;
      pcVar4 = extraout_RDX_01;
    }
    else {
      end_local = ptr + 2;
      local_34 = 0x12;
      pcVar4 = extraout_RDX_00;
    }
    goto LAB_00a815f5;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    ppcVar6 = (char **)ptr;
    pcVar4 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar4 != 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    iVar3 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_02,ppcVar6);
    if (iVar3 == 0) {
      iVar3 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_03,ppcVar6);
      if (iVar3 == 0) {
        *nextTokPtr = ptr;
        return 0;
      }
      end_local = ptr + 3;
      local_34 = 0x13;
      pcVar4 = extraout_RDX_04;
    }
    else {
      end_local = ptr + 3;
      local_34 = 0x12;
      pcVar4 = extraout_RDX_03;
    }
    goto LAB_00a815f5;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    ppcVar6 = (char **)ptr;
    iVar3 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)ptr);
    if (iVar3 != 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX_05,(char *)ppcVar6);
    if (iVar3 == 0) {
      iVar3 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_06,ppcVar6);
      if (iVar3 == 0) {
        *nextTokPtr = ptr;
        return 0;
      }
      end_local = ptr + 4;
      local_34 = 0x13;
      pcVar4 = extraout_RDX_07;
    }
    else {
      end_local = ptr + 4;
      local_34 = 0x12;
      pcVar4 = extraout_RDX_06;
    }
    goto LAB_00a815f5;
  case 9:
    if (ptr + 1 == end) {
      *nextTokPtr = end;
      return -0xf;
    }
  case 10:
  case 0x15:
    end_local = ptr;
    do {
      while( true ) {
        pbVar5 = (byte *)(end_local + 1);
        if ((long)end - (long)pbVar5 < 1) {
          *nextTokPtr = (char *)pbVar5;
          return 0xf;
        }
        cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar5);
        if (cVar1 == '\t') break;
        end_local = (char *)pbVar5;
        if ((cVar1 != '\n') && (cVar1 != '\x15')) goto LAB_00a810ef;
      }
      pcVar4 = end_local + 2;
      end_local = (char *)pbVar5;
    } while (pcVar4 != end);
LAB_00a810ef:
    *nextTokPtr = (char *)pbVar5;
    enc_local._4_4_ = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 1;
    enc_local._4_4_ = 0x11;
    break;
  case 0xc:
    enc_local._4_4_ = normal_scanLit(0xc,enc,ptr + 1,end,nextTokPtr);
    break;
  case 0xd:
    enc_local._4_4_ = normal_scanLit(0xd,enc,ptr + 1,end,nextTokPtr);
    break;
  case 0x13:
    enc_local._4_4_ = normal_scanPoundName(enc,ptr + 1,end,nextTokPtr);
    break;
  case 0x14:
    *nextTokPtr = ptr + 1;
    enc_local._4_4_ = 0x19;
    break;
  case 0x16:
  case 0x18:
    local_34 = 0x12;
    end_local = ptr + 1;
    goto LAB_00a815f5;
  case 0x19:
  case 0x1a:
  case 0x1b:
    local_34 = 0x13;
    end_local = ptr + 1;
LAB_00a815f5:
    while (0 < (long)end - (long)end_local) {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
      case 5:
        if ((long)end - (long)end_local < 2) {
          return -2;
        }
        ppcVar6 = (char **)end_local;
        iVar3 = (*enc[3].nameLength)(enc,end_local);
        if ((iVar3 != 0) ||
           (iVar3 = (*enc[3].scanners[0])(enc,end_local,extraout_RDX_08,ppcVar6), iVar3 == 0)) {
          *nextTokPtr = end_local;
          return 0;
        }
        end_local = end_local + 2;
        pcVar4 = extraout_RDX_09;
        break;
      case 6:
        if ((long)end - (long)end_local < 3) {
          return -2;
        }
        ppcVar6 = (char **)end_local;
        pcVar4 = (*enc[3].skipS)(enc,end_local);
        if (((int)pcVar4 != 0) ||
           (iVar3 = (*enc[3].scanners[1])(enc,end_local,extraout_RDX_10,ppcVar6), iVar3 == 0)) {
          *nextTokPtr = end_local;
          return 0;
        }
        end_local = end_local + 3;
        pcVar4 = extraout_RDX_11;
        break;
      case 7:
        if ((long)end - (long)end_local < 4) {
          return -2;
        }
        ppcVar6 = (char **)end_local;
        iVar3 = (*enc[3].getAtts)(enc,end_local,(int)pcVar4,(ATTRIBUTE *)end_local);
        if ((iVar3 != 0) ||
           (iVar3 = (*enc[3].scanners[2])(enc,end_local,extraout_RDX_12,ppcVar6), iVar3 == 0)) {
          *nextTokPtr = end_local;
          return 0;
        }
        end_local = end_local + 4;
        pcVar4 = extraout_RDX_13;
        break;
      default:
        *nextTokPtr = end_local;
        return 0;
      case 9:
      case 10:
      case 0xb:
      case 0x14:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x23:
      case 0x24:
        *nextTokPtr = end_local;
        return local_34;
      case 0xf:
        if (local_34 == 0x13) {
          *nextTokPtr = end_local;
          return 0;
        }
        *nextTokPtr = end_local + 1;
        return 0x1e;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        end_local = end_local + 1;
        break;
      case 0x1d:
        *nextTokPtr = end_local;
        return 0;
      case 0x21:
        if (local_34 == 0x13) {
          *nextTokPtr = end_local;
          return 0;
        }
        *nextTokPtr = end_local + 1;
        return 0x1f;
      case 0x22:
        if (local_34 == 0x13) {
          *nextTokPtr = end_local;
          return 0;
        }
        *nextTokPtr = end_local + 1;
        return 0x20;
      }
    }
    enc_local._4_4_ = -local_34;
    break;
  case 0x1d:
  default:
    *nextTokPtr = ptr;
    return 0;
  case 0x1e:
    enc_local._4_4_ = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
    break;
  case 0x1f:
    *nextTokPtr = ptr + 1;
    enc_local._4_4_ = 0x17;
    break;
  case 0x20:
    pbVar5 = (byte *)(ptr + 1);
    if ((long)end - (long)pbVar5 < 1) {
      enc_local._4_4_ = -0x18;
    }
    else {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar5)) {
      case 9:
      case 10:
      case 0xb:
      case 0x15:
      case 0x20:
      case 0x23:
      case 0x24:
        *nextTokPtr = (char *)pbVar5;
        enc_local._4_4_ = 0x18;
        break;
      default:
        *nextTokPtr = (char *)pbVar5;
        enc_local._4_4_ = 0;
        break;
      case 0xf:
        *nextTokPtr = ptr + 2;
        enc_local._4_4_ = 0x23;
        break;
      case 0x21:
        *nextTokPtr = ptr + 2;
        enc_local._4_4_ = 0x24;
        break;
      case 0x22:
        *nextTokPtr = ptr + 2;
        enc_local._4_4_ = 0x25;
      }
    }
    break;
  case 0x23:
    *nextTokPtr = ptr + 1;
    enc_local._4_4_ = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 1;
    enc_local._4_4_ = 0x15;
  }
  return enc_local._4_4_;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr) {
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT: {
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_EXCL:
      return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_QUEST:
      return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_NMSTRT:
    case BT_HEX:
    case BT_NONASCII:
    case BT_LEAD2:
    case BT_LEAD3:
    case BT_LEAD4:
      *nextTokPtr = ptr - MINBPC(enc);
      return XML_TOK_INSTANCE_START;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S:
  case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2 * MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR:
    case BT_LF:
    case BT_S:
    case BT_GT:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n)                                                         \
      return XML_TOK_PARTIAL_CHAR;                                             \
    if (IS_INVALID_CHAR(enc, ptr, n)) {                                        \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_INVALID;                                                  \
    }                                                                          \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) {                                         \
      ptr += n;                                                                \
      tok = XML_TOK_NAME;                                                      \
      break;                                                                   \
    }                                                                          \
    if (IS_NAME_CHAR(enc, ptr, n)) {                                           \
      ptr += n;                                                                \
      tok = XML_TOK_NMTOKEN;                                                   \
      break;                                                                   \
    }                                                                          \
    *nextTokPtr = ptr;                                                         \
    return XML_TOK_INVALID;
    LEAD_CASE(2)
    LEAD_CASE(3)
    LEAD_CASE(4)
#  undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#  ifdef XML_NS
  case BT_COLON:
#  endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT:
    case BT_RPAR:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_LSQB:
    case BT_PERCNT:
    case BT_S:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#  ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#  endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}